

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O2

SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
* __thiscall
data_structures::
SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
::set(SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
      *this,int *key,
     WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
     *value)

{
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar1;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar2;
  SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  local_30;
  
  pLVar2 = (this->_list)._header;
  local_30.key = *key;
  do {
    pLVar2 = pLVar2->_next;
    if (pLVar2 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      local_30._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010bb48;
      local_30.value.from = value->from;
      local_30.value.to = value->to;
      local_30.value.weight = value->weight;
      LinkedList<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::insertToTail(&this->_list,&local_30);
      return this;
    }
  } while ((pLVar2->element).key != local_30.key);
  pRVar1 = value->to;
  (pLVar2->element).value.from = value->from;
  (pLVar2->element).value.to = pRVar1;
  (pLVar2->element).value.weight = value->weight;
  return this;
}

Assistant:

inline
    SymbolTable<Key, Value>& SymbolTable<Key, Value>::set(const Key &key, const Value &value){
        for (auto node = _list.begin(); node != _list.end(); node = node->next()) {
            if (node->element.key == key) {
                node->element.value = value;
                return *this;
            }
        }
        _list.insertToTail(SymbolTableElement<Key, Value>(key, value));
        return *this;
    }